

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool __thiscall Lexer::next(Lexer *this,Token req)

{
  bool bVar1;
  int iVar2;
  Token TVar3;
  _Self local_60;
  undefined1 local_40 [8];
  Iterator pos;
  Token req_local;
  Lexer *this_local;
  
  pos._M_node._4_4_ = req;
  std::_Deque_iterator<Lexer::TokenInfo,_Lexer::TokenInfo_&,_Lexer::TokenInfo_*>::_Deque_iterator
            ((_Deque_iterator<Lexer::TokenInfo,_Lexer::TokenInfo_&,_Lexer::TokenInfo_*> *)local_40,
             &this->m_tokenPosition);
  bVar1 = List<Lexer::TokenInfo>::isEmpty(&this->m_tokens);
  if ((bVar1) || (iVar2 = List<Lexer::TokenInfo>::size(&this->m_tokens), iVar2 == 1)) {
    return false;
  }
  std::_Deque_iterator<Lexer::TokenInfo,_Lexer::TokenInfo_&,_Lexer::TokenInfo_*>::operator++
            (&local_60,&this->m_tokenPosition,0);
  bVar1 = isAtEnd(this);
  if ((!bVar1) &&
     ((pos._M_node._4_4_ == Any || (TVar3 = tokenType(this), TVar3 == pos._M_node._4_4_)))) {
    return true;
  }
  (this->m_tokenPosition)._M_cur = (_Elt_pointer)local_40;
  (this->m_tokenPosition)._M_first = pos._M_cur;
  (this->m_tokenPosition)._M_last = pos._M_first;
  (this->m_tokenPosition)._M_node = (_Map_pointer)pos._M_last;
  return false;
}

Assistant:

bool Lexer::next (Token req)
{
	Iterator pos = m_tokenPosition;

	if (m_tokens.isEmpty() || m_tokens.size() == 1) // is 1 due to extra dummy token in the beginning
		return false;

	m_tokenPosition++;

	if (isAtEnd() or (req !=Token::Any and tokenType() != req))
	{
		m_tokenPosition = pos;
		return false;
	}

	return true;
}